

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.cpp
# Opt level: O3

int str_find_aux(lua_State *L,int find)

{
  char *__s1;
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *__s;
  lua_Integer lVar4;
  char *pcVar5;
  size_t __n;
  char *__s_00;
  long lVar6;
  long lVar7;
  ulong n;
  char *pcVar8;
  bool bVar9;
  size_t l2;
  size_t l1;
  MatchState ms;
  ulong local_260;
  ulong local_258;
  MatchState local_250;
  
  pcVar3 = luaL_checklstring(L,1,&local_258);
  __s = luaL_checklstring(L,2,&local_260);
  lVar4 = luaL_optinteger(L,3,1);
  lVar6 = (lVar4 >> 0x3f & local_258 + 1) + lVar4;
  lVar7 = 0;
  if (0 < lVar6) {
    lVar7 = lVar6;
  }
  n = lVar7 - 1U;
  if (local_258 <= lVar7 - 1U) {
    n = local_258;
  }
  if (lVar6 < 1) {
    n = 0;
  }
  if ((find == 0) ||
     ((iVar2 = lua_toboolean(L,4), iVar2 == 0 &&
      (pcVar5 = strpbrk(__s,"^$*+?.([%-"), pcVar5 != (char *)0x0)))) {
    cVar1 = *__s;
    local_250.src_end = pcVar3 + local_258;
    pcVar5 = pcVar3 + n;
    local_250.src_init = pcVar3;
    local_250.L = L;
    do {
      n = n + 1;
      local_250.level = 0;
      pcVar8 = match(&local_250,pcVar5,__s + (cVar1 == '^'));
      if (pcVar8 != (char *)0x0) {
        if (find != 0) {
          lua_pushinteger(L,n);
          lua_pushinteger(L,(long)pcVar8 - (long)pcVar3);
          iVar2 = push_captures(&local_250,(char *)0x0,(char *)0x0);
          return iVar2 + 2;
        }
        iVar2 = push_captures(&local_250,pcVar5,pcVar8);
        return iVar2;
      }
    } while ((cVar1 != '^') && (bVar9 = pcVar5 < local_250.src_end, pcVar5 = pcVar5 + 1, bVar9));
  }
  else {
    pcVar5 = pcVar3 + n;
    if (local_260 == 0) {
      if (pcVar3 != (char *)0x0) {
LAB_00113e0c:
        lua_pushinteger(L,(lua_Integer)(pcVar5 + (1 - (long)pcVar3)));
        lua_pushinteger(L,(lua_Integer)(pcVar5 + (local_260 - (long)pcVar3)));
        return 2;
      }
    }
    else if (local_260 <= local_258 - n) {
      __n = local_260 - 1;
      pcVar8 = (char *)((local_258 - n) - __n);
      if (pcVar8 != (char *)0x0) {
        cVar1 = *__s;
        __s_00 = pcVar5;
        do {
          pcVar5 = (char *)memchr(__s_00,(int)cVar1,(size_t)pcVar8);
          if (pcVar5 == (char *)0x0) break;
          __s1 = pcVar5 + 1;
          iVar2 = bcmp(__s1,__s + 1,__n);
          if (iVar2 == 0) goto LAB_00113e0c;
          pcVar8 = __s_00 + ((long)pcVar8 - (long)__s1);
          __s_00 = __s1;
        } while (pcVar8 != (char *)0x0);
      }
    }
  }
  lua_pushnil(L);
  return 1;
}

Assistant:

static int str_find_aux (lua_State *L, int find) {
  size_t l1, l2;
  const char *s = luaL_checklstring(L, 1, &l1);
  const char *p = luaL_checklstring(L, 2, &l2);
  ptrdiff_t init = posrelat(luaL_optinteger(L, 3, 1), l1) - 1;
  if (init < 0) init = 0;
  else if ((size_t)(init) > l1) init = (ptrdiff_t)l1;
  if (find && (lua_toboolean(L, 4) ||  /* explicit request? */
      strpbrk(p, SPECIALS) == NULL)) {  /* or no special characters? */
    /* do a plain search */
    const char *s2 = lmemfind(s+init, l1-init, p, l2);
    if (s2) {
      lua_pushinteger(L, s2-s+1);
      lua_pushinteger(L, s2-s+l2);
      return 2;
    }
  }
  else {
    MatchState ms;
    int anchor = (*p == '^') ? (p++, 1) : 0;
    const char *s1=s+init;
    ms.L = L;
    ms.src_init = s;
    ms.src_end = s+l1;
    do {
      const char *res;
      ms.level = 0;
      if ((res=match(&ms, s1, p)) != NULL) {
        if (find) {
          lua_pushinteger(L, s1-s+1);  /* start */
          lua_pushinteger(L, res-s);   /* end */
          return push_captures(&ms, NULL, 0) + 2;
        }
        else
          return push_captures(&ms, s1, res);
      }
    } while (s1++ < ms.src_end && !anchor);
  }
  lua_pushnil(L);  /* not found */
  return 1;
}